

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

void touch_file(char *path)

{
  FILE *__stream;
  int local_1c;
  int i;
  FILE *fp;
  char *path_local;
  
  __stream = fopen64("testfile","w+");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0x3b,"(fp = fopen(FIXTURE, \"w+\"))");
    abort();
  }
  touch_file::count = touch_file::count + 1;
  local_1c = touch_file::count;
  while (local_1c != 0) {
    fputc(0x2a,__stream);
    local_1c = local_1c + -1;
  }
  fclose(__stream);
  return;
}

Assistant:

static void touch_file(const char* name) {
  int r;
  uv_os_fd_t file;
  uv_fs_t req;
  uv_buf_t buf;

  r = uv_fs_open(NULL, &req, name, UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  buf = uv_buf_init("foo", 4);
  r = uv_fs_write(NULL, &req, file, &buf, 1, -1, NULL);
  ASSERT_GE(r, 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
}